

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O3

void ImNodes::EndCanvas(void)

{
  ImGuiStorage *this;
  undefined8 *puVar1;
  ImGuiWindow *pIVar2;
  float *pfVar3;
  bool bVar4;
  int iVar5;
  ImU32 IVar6;
  ImGuiID id;
  ImDrawList *this_00;
  ImGuiPayload *pIVar7;
  ImGuiContext *pIVar8;
  ImGuiIO *pIVar9;
  ImVec2 IVar10;
  ImVec2 local_50;
  float local_44;
  ImVec2 local_40;
  float local_38;
  float local_34;
  
  if (gCanvas == (float *)0x0) {
    __assert_fail("gCanvas != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x10b,"void ImNodes::EndCanvas()");
  }
  this_00 = ImGui::GetWindowDrawList();
  pfVar3 = gCanvas;
  this = *(ImGuiStorage **)(gCanvas + 0x26);
  ImGui::GetStyle();
  pIVar7 = ImGui::GetDragDropPayload();
  if (pIVar7 != (ImGuiPayload *)0x0) {
    iVar5 = strncmp(pIVar7->DataType,"new-node-connection-",0x14);
    if (iVar5 == 0) {
      puVar1 = (undefined8 *)pIVar7->Data;
      IVar6 = MakeSlotDataID("x",(char *)puVar1[1],(void *)*puVar1,
                             SUB41((uint)*(undefined4 *)(puVar1 + 2) >> 0x1f,0));
      local_44 = ImGuiStorage::GetFloat(this,IVar6,0.0);
      IVar6 = MakeSlotDataID("y",(char *)puVar1[1],(void *)*puVar1,
                             SUB41((uint)*(undefined4 *)(puVar1 + 2) >> 0x1f,0));
      local_50.y = ImGuiStorage::GetFloat(this,IVar6,0.0);
      if (*(int *)(puVar1 + 2) < 0) {
        local_50.x = local_44 + pfVar3[0x24] * *pfVar3;
        local_40 = ImGui::GetMousePos();
      }
      else {
        local_38 = local_50.y;
        local_34 = pfVar3[0x24] * *pfVar3;
        local_50 = ImGui::GetMousePos();
        local_40.y = local_38;
        local_40.x = local_44 - local_34;
      }
      RenderConnection(&local_50,&local_40,pfVar3[0x23]);
    }
  }
  iVar5 = this[8].Data.Size;
  pIVar8 = ImGui::GetCurrentContext();
  if (iVar5 <= pIVar8->FrameCount) {
    this[7].Data.Data = (Pair *)0x0;
  }
  iVar5 = this[8].Data.Capacity;
  if (iVar5 == 2) {
    bVar4 = ImGui::IsMouseDown(0);
    if (bVar4) {
      local_50 = ImGui::GetMousePos();
      IVar6 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)(pfVar3 + 0x1b));
      ImDrawList::AddRectFilled(this_00,(ImVec2 *)(this + 6),&local_50,IVar6,0.0,0xf);
      local_50 = ImGui::GetMousePos();
      IVar6 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)(pfVar3 + 0x1f));
      ImDrawList::AddRect(this_00,(ImVec2 *)(this + 6),&local_50,IVar6,0.0,0xf,1.0);
    }
    else {
      ImGui::ClearActiveID();
      this[8].Data.Capacity = 0;
    }
  }
  else if (iVar5 == 1) {
    bVar4 = ImGui::IsMouseDown(0);
    if (!bVar4) {
      this[8].Data.Capacity = 0;
      this[6].Data.Data = (Pair *)0x0;
    }
  }
  else if (iVar5 == 0) {
    id = ImGui::GetID("canvas");
    bVar4 = ImGui::IsMouseDown(0);
    if (bVar4) {
      pIVar2 = GImGui->CurrentWindow;
      pIVar2->WriteAccessed = true;
      IVar10 = ImGui::GetMousePos();
      if (((((pIVar2->ContentsRegionRect).Min.x <= IVar10.x) &&
           ((pIVar2->ContentsRegionRect).Min.y <= IVar10.y)) &&
          (IVar10.x < (pIVar2->ContentsRegionRect).Max.x)) &&
         (IVar10.y < (pIVar2->ContentsRegionRect).Max.y)) {
        bVar4 = ImGui::IsWindowHovered(0);
        if (bVar4) {
          bVar4 = ImGui::IsWindowFocused(0);
          if (!bVar4) {
            pIVar2 = GImGui->CurrentWindow;
            pIVar2->WriteAccessed = true;
            ImGui::FocusWindow(pIVar2);
          }
          bVar4 = ImGui::IsAnyItemActive();
          if (!bVar4) {
            pIVar2 = GImGui->CurrentWindow;
            pIVar2->WriteAccessed = true;
            ImGui::SetActiveID(id,pIVar2);
            pIVar9 = ImGui::GetIO();
            if ((pIVar9->KeyCtrl == false) && (pIVar9->KeyShift == false)) {
              this[7].Data.Data = (Pair *)0x0;
              pIVar8 = ImGui::GetCurrentContext();
              this[8].Data.Size = pIVar8->FrameCount + 1;
            }
          }
        }
        if (GImGui->ActiveId == id) {
          bVar4 = ImGui::IsMouseDragging(0,-1.0);
          if (bVar4) {
            IVar10 = ImGui::GetMousePos();
            *(ImVec2 *)(this + 6) = IVar10;
            this[8].Data.Capacity = 2;
          }
        }
        goto LAB_001513b4;
      }
    }
    if (GImGui->ActiveId == id) {
      ImGui::ClearActiveID();
    }
  }
LAB_001513b4:
  ImGui::SetWindowFontScale(1.0);
  ImGui::PopID();
  gCanvas._0_4_ = this[9].Data.Size;
  gCanvas._4_4_ = this[9].Data.Capacity;
  return;
}

Assistant:

void EndCanvas()
{
    assert(gCanvas != nullptr);     // Did you forget calling BeginCanvas()?

    ImDrawList* draw_list = ImGui::GetWindowDrawList();
    auto* canvas = gCanvas;
    auto* impl = canvas->_impl;
    const ImGuiStyle& style = ImGui::GetStyle();

    // Draw pending connection
    if (const ImGuiPayload* payload = ImGui::GetDragDropPayload())
    {
        char data_type_fragment[] = "new-node-connection-";
        if (strncmp(payload->DataType, data_type_fragment, sizeof(data_type_fragment) - 1) == 0)
        {
            auto* drag_data = (_DragConnectionPayload*)payload->Data;
            ImVec2 slot_pos{
                impl->cached_data.GetFloat(MakeSlotDataID("x", drag_data->slot_title, drag_data->node_id,
                    IsInputSlotKind(drag_data->slot_kind))),
                impl->cached_data.GetFloat(MakeSlotDataID("y", drag_data->slot_title, drag_data->node_id,
                    IsInputSlotKind(drag_data->slot_kind))),
            };

            float connection_indent = canvas->style.connection_indent * canvas->zoom;

            ImVec2 input_pos, output_pos;
            if (IsInputSlotKind(drag_data->slot_kind))
            {
                input_pos = slot_pos;
                input_pos.x += connection_indent;
                output_pos = ImGui::GetMousePos();
            }
            else
            {
                input_pos = ImGui::GetMousePos();
                output_pos = slot_pos;
                output_pos.x -= connection_indent;
            }

            RenderConnection(input_pos, output_pos, canvas->style.curve_thickness);
        }
    }

    if (impl->do_selections_frame <= ImGui::GetCurrentContext()->FrameCount)
        impl->single_selected_node = nullptr;

    switch (impl->state)
    {
    case State_None:
    {
        ImGuiID canvas_id = ImGui::GetID("canvas");
        if (ImGui::IsMouseDown(0) && ImGui::GetCurrentWindow()->ContentsRegionRect.Contains(ImGui::GetMousePos()))
        {
            if (ImGui::IsWindowHovered())
            {
                if (!ImGui::IsWindowFocused())
                    ImGui::FocusWindow(ImGui::GetCurrentWindow());

                if (!ImGui::IsAnyItemActive())
                {
                    ImGui::SetActiveID(canvas_id, ImGui::GetCurrentWindow());
                    const ImGuiIO& io = ImGui::GetIO();
                    if (!io.KeyCtrl && !io.KeyShift)
                    {
                        impl->single_selected_node = nullptr;   // unselect all
                        impl->do_selections_frame = ImGui::GetCurrentContext()->FrameCount + 1;
                    }
                }
            }

            if (ImGui::GetActiveID() == canvas_id && ImGui::IsMouseDragging(0))
            {
                impl->selection_start = ImGui::GetMousePos();
                impl->state = State_Select;
            }
        }
        else if (ImGui::GetActiveID() == canvas_id)
            ImGui::ClearActiveID();
        break;
    }
    case State_Drag:
    {
        if (!ImGui::IsMouseDown(0))
        {
            impl->state = State_None;
            impl->drag_node = nullptr;
        }
        break;
    }
    case State_Select:
    {
        if (ImGui::IsMouseDown(0))
        {
            draw_list->AddRectFilled(impl->selection_start, ImGui::GetMousePos(), canvas->colors[ColSelectBg]);
            draw_list->AddRect(impl->selection_start, ImGui::GetMousePos(), canvas->colors[ColSelectBorder]);
        }
        else
        {
            ImGui::ClearActiveID();
            impl->state = State_None;
        }
        break;
    }
    }

    ImGui::SetWindowFontScale(1.f);
    ImGui::PopID();     // canvas
    gCanvas = impl->prev_canvas;
}